

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void __thiscall
HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::HashTable
          (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *this,ArenaAllocator *allocator,
          uint tableSize)

{
  SListBase<Bucket<IR::LabelInstr_*>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  DictionaryStats *pDVar2;
  long lVar3;
  
  this->alloc = allocator;
  this->tableSize = tableSize;
  this->table = (SListBase<Bucket<IR::LabelInstr_*>,_Memory::ArenaAllocator,_RealCount> *)(this + 1)
  ;
  if (tableSize != 0) {
    lVar3 = 0;
    do {
      pSVar1 = this->table;
      *(undefined4 *)((long)&(pSVar1->super_RealCount).count + lVar3) = 0;
      *(long *)((long)&(pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar3) =
           (long)&(pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar3;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)tableSize << 4 != lVar3);
  }
  pDVar2 = DictionaryStats::Create
                     ("P9HashTableIPN2IR10LabelInstrEN6Memory14ArenaAllocatorEE",tableSize);
  this->stats = pDVar2;
  return;
}

Assistant:

HashTable(TAllocator * allocator, DECLSPEC_GUARD_OVERFLOW uint tableSize) : alloc(allocator), tableSize(tableSize)
    {
        Init();
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }